

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

uint __thiscall ExpressionContext::GetTypeIndex(ExpressionContext *this,TypeBase *type)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = (this->types).count;
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      if ((this->types).data[lVar2] == type) {
        return (uint)lVar2;
      }
      lVar2 = lVar2 + 1;
    } while (uVar1 != (uint)lVar2);
  }
  __assert_fail("index != ~0u",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x612,"unsigned int ExpressionContext::GetTypeIndex(TypeBase *)");
}

Assistant:

unsigned ExpressionContext::GetTypeIndex(TypeBase *type)
{
	unsigned index = ~0u;

	for(unsigned i = 0, e = types.count; i < e; i++)
	{
		if(types.data[i] == type)
		{
			index = i;
			break;
		}
	}

	assert(index != ~0u);

	return index;
}